

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void block(LexState *ls)

{
  FuncState *fs;
  BlockCnt bl;
  BlockCnt local_18;
  
  fs = ls->fs;
  local_18.breaklist = -1;
  local_18.isbreakable = '\0';
  local_18.nactvar = fs->nactvar;
  local_18.upval = '\0';
  local_18.previous = fs->bl;
  fs->bl = &local_18;
  chunk(ls);
  leaveblock(fs);
  return;
}

Assistant:

static void block(LexState*ls){
FuncState*fs=ls->fs;
BlockCnt bl;
enterblock(fs,&bl,0);
chunk(ls);
leaveblock(fs);
}